

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O3

void __thiscall QExpandingLineEdit::updateMinimumWidth(QExpandingLineEdit *this)

{
  int w;
  QStyle *pQVar1;
  long in_FS_OFFSET;
  QMargins QVar2;
  QMargins QVar3;
  QStyleOptionFrame opt;
  int local_80 [2];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QLineEdit::textMargins((QLineEdit *)this);
  QVar3 = QWidget::contentsMargins((QWidget *)this);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)&local_78);
  (**(code **)(*(long *)this + 0x1a0))(this,(QStyleOptionFrame *)&local_78);
  pQVar1 = QWidget::style((QWidget *)this);
  local_80[1] = 0;
  local_80[0] = QVar3.m_right.m_i.m_i +
                QVar2.m_right.m_i.m_i + QVar2.m_left.m_i.m_i + QVar3.m_left.m_i.m_i + 4;
  w = (**(code **)(*(long *)pQVar1 + 0xe8))(pQVar1,0xe,(QStyleOptionFrame *)&local_78,local_80,this)
  ;
  QWidget::setMinimumWidth((QWidget *)this,w);
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QExpandingLineEdit::updateMinimumWidth()
{
    const QMargins tm = textMargins();
    const QMargins cm = contentsMargins();
    const int width = tm.left() + tm.right() + cm.left() + cm.right() + 4 /*horizontalMargin in qlineedit.cpp*/;

    QStyleOptionFrame opt;
    initStyleOption(&opt);

    int minWidth = style()->sizeFromContents(QStyle::CT_LineEdit, &opt, QSize(width, 0), this).width();
    setMinimumWidth(minWidth);
}